

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O3

Vec_Ptr_t *
Dar_ManChoiceSynthesis(Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fPower,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Aig_Man_t *pAVar3;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 8;
  ppvVar2 = (void **)malloc(0x40);
  pVVar1->pArray = ppvVar2;
  pAVar3 = Aig_ManDupDfs(pAig);
  *ppvVar2 = pAVar3;
  pAVar3 = Dar_ManCompress(pAVar3,fBalance,fUpdateLevel,fPower,fVerbose);
  ppvVar2[1] = pAVar3;
  pAVar3 = Dar_ManCompress2(pAVar3,fBalance,fUpdateLevel,1,fPower,fVerbose);
  pVVar1->nSize = 3;
  ppvVar2[2] = pAVar3;
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Dar_ManChoiceSynthesis( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fPower, int fVerbose )
//alias resyn    "b; rw; rwz; b; rwz; b"
//alias resyn2   "b; rw; rf; b; rw; rwz; b; rfz; rwz; b"
{
    Vec_Ptr_t * vAigs;

    vAigs = Vec_PtrAlloc( 3 );
    pAig = Aig_ManDupDfs(pAig);
    Vec_PtrPush( vAigs, pAig );

    pAig = Dar_ManCompress(pAig, fBalance, fUpdateLevel, fPower, fVerbose);
    Vec_PtrPush( vAigs, pAig );
//Aig_ManPrintStats( pAig );

    pAig = Dar_ManCompress2(pAig, fBalance, fUpdateLevel, 1, fPower, fVerbose);
    Vec_PtrPush( vAigs, pAig );
//Aig_ManPrintStats( pAig );

    pAig = (Aig_Man_t *)Vec_PtrEntry( vAigs, 1 );
    return vAigs;
}